

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Metadata.cpp
# Opt level: O3

void __thiscall Assimp::X3DImporter::ParseNode_MetadataSet(X3DImporter *this)

{
  size_t *psVar1;
  _List_node_base **pp_Var2;
  FIReader *pFVar3;
  char *pcVar4;
  CX3DImporter_NodeElement *pCVar5;
  list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_> *plVar6;
  bool bVar7;
  uint uVar8;
  int iVar9;
  undefined4 extraout_var;
  char *__s;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  _List_node_base *p_Var10;
  CX3DImporter_NodeElement *pParentElement;
  string *extraout_RDX;
  string *psVar11;
  uint uVar12;
  ulong uVar13;
  string an;
  string use;
  string def;
  string reference;
  string name;
  allocator<char> local_e1;
  string local_e0;
  CX3DImporter_NodeElement *local_c0;
  string local_b8;
  string local_98;
  string local_78;
  X3DImporter *local_58;
  string local_50;
  undefined4 extraout_var_00;
  
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_98._M_string_length = 0;
  local_98.field_2._M_local_buf[0] = '\0';
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  local_b8._M_string_length = 0;
  local_b8.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  local_c0 = (CX3DImporter_NodeElement *)0x0;
  uVar8 = (*(((this->mReader)._M_t.
              super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
              super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
              super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
            super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[4])();
  if (0 < (int)uVar8) {
    uVar13 = 0;
    local_58 = this;
    do {
      pFVar3 = (this->mReader)._M_t.
               super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
               super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
               super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
      iVar9 = (*(pFVar3->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[5])
                        (pFVar3,uVar13);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e0,(char *)CONCAT44(extraout_var,iVar9),&local_e1);
      iVar9 = std::__cxx11::string::compare((char *)&local_e0);
      if (iVar9 == 0) {
        iVar9 = (*(((this->mReader)._M_t.
                    super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                    .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                  super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])();
        __s = (char *)CONCAT44(extraout_var_00,iVar9);
        psVar11 = &local_98;
LAB_0062d163:
        pcVar4 = (char *)psVar11->_M_string_length;
        strlen(__s);
        std::__cxx11::string::_M_replace((ulong)psVar11,0,pcVar4,(ulong)__s);
        this = local_58;
      }
      else {
        iVar9 = std::__cxx11::string::compare((char *)&local_e0);
        if (iVar9 == 0) {
          iVar9 = (*(((this->mReader)._M_t.
                      super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                      .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                    super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])();
          __s = (char *)CONCAT44(extraout_var_01,iVar9);
          psVar11 = &local_b8;
          goto LAB_0062d163;
        }
        iVar9 = std::__cxx11::string::compare((char *)&local_e0);
        if (((iVar9 != 0) && (iVar9 = std::__cxx11::string::compare((char *)&local_e0), iVar9 != 0))
           && (iVar9 = std::__cxx11::string::compare((char *)&local_e0), iVar9 != 0)) {
          iVar9 = std::__cxx11::string::compare((char *)&local_e0);
          if (iVar9 == 0) {
            iVar9 = (*(((this->mReader)._M_t.
                        super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                        .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                      super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])();
            __s = (char *)CONCAT44(extraout_var_02,iVar9);
            psVar11 = &local_50;
          }
          else {
            iVar9 = std::__cxx11::string::compare((char *)&local_e0);
            if (iVar9 != 0) {
              Throw_IncorrectAttr(this,&local_e0);
              goto LAB_0062d18a;
            }
            iVar9 = (*(((this->mReader)._M_t.
                        super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                        .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                      super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])();
            __s = (char *)CONCAT44(extraout_var_03,iVar9);
            psVar11 = &local_78;
          }
          goto LAB_0062d163;
        }
      }
LAB_0062d18a:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
      uVar12 = (int)uVar13 + 1;
      uVar13 = (ulong)uVar12;
    } while (uVar8 != uVar12);
  }
  if (local_b8._M_string_length == 0) {
    pParentElement = (CX3DImporter_NodeElement *)operator_new(0xa8);
    pCVar5 = this->NodeElement_Cur;
    pParentElement->Type = ENET_MetaSet;
    (pParentElement->ID)._M_dataplus._M_p = (pointer)&(pParentElement->ID).field_2;
    (pParentElement->ID)._M_string_length = 0;
    (pParentElement->ID).field_2._M_local_buf[0] = '\0';
    pParentElement->Parent = pCVar5;
    (pParentElement->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&pParentElement->Child;
    (pParentElement->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&pParentElement->Child;
    (pParentElement->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node._M_size = 0;
    pParentElement[1]._vptr_CX3DImporter_NodeElement = (_func_int **)&pParentElement[1].ID;
    *(undefined8 *)&pParentElement[1].Type = 0;
    *(undefined1 *)&pParentElement[1].ID._M_dataplus._M_p = 0;
    pParentElement[1].ID.field_2._M_allocated_capacity = (size_type)&pParentElement[1].Parent;
    *(undefined8 *)((long)&pParentElement[1].ID.field_2 + 8) = 0;
    *(undefined1 *)&pParentElement[1].Parent = 0;
    pParentElement->_vptr_CX3DImporter_NodeElement =
         (_func_int **)&PTR__CX3DImporter_NodeElement_MetaSet_008cf818;
    pp_Var2 = &pParentElement[1].Child.
               super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
               ._M_impl._M_node.super__List_node_base._M_prev;
    pParentElement[1].Child.
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node._M_size = (size_t)pp_Var2;
    pParentElement[1].Child.
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)pp_Var2;
    pParentElement[2]._vptr_CX3DImporter_NodeElement = (_func_int **)0x0;
    if (local_98._M_string_length != 0) {
      std::__cxx11::string::_M_assign((string *)&pParentElement->ID);
    }
    std::__cxx11::string::_M_assign((string *)pParentElement[1].ID.field_2._M_local_buf);
    iVar9 = (*(((this->mReader)._M_t.
                super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t
                .super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
                super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
              super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xf])();
    if ((char)iVar9 == '\0') {
      local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"MetadataSet","");
      ParseNode_Metadata(this,pParentElement,extraout_RDX);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      pCVar5 = this->NodeElement_Cur;
      p_Var10 = (_List_node_base *)operator_new(0x18);
      p_Var10[1]._M_next = (_List_node_base *)pParentElement;
      std::__detail::_List_node_base::_M_hook(p_Var10);
      psVar1 = &(pCVar5->Child).
                super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
    }
    p_Var10 = (_List_node_base *)operator_new(0x18);
    p_Var10[1]._M_next = (_List_node_base *)pParentElement;
    std::__detail::_List_node_base::_M_hook(p_Var10);
    plVar6 = &this->NodeElement_List;
  }
  else {
    XML_CheckNode_MustBeEmpty(this);
    if (local_98._M_string_length != 0) {
      Throw_DEF_And_USE(this);
    }
    bVar7 = FindNodeElement(this,&local_b8,ENET_MetaSet,&local_c0);
    if (!bVar7) {
      Throw_USE_NotFound(this,&local_b8);
    }
    pCVar5 = this->NodeElement_Cur;
    p_Var10 = (_List_node_base *)operator_new(0x18);
    p_Var10[1]._M_next = (_List_node_base *)local_c0;
    std::__detail::_List_node_base::_M_hook(p_Var10);
    plVar6 = &pCVar5->Child;
  }
  psVar1 = &(plVar6->
            super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
            )._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                             local_78.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                             local_b8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                             local_98.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void X3DImporter::ParseNode_MetadataSet()
{
    std::string def, use;
    std::string name, reference;
    CX3DImporter_NodeElement* ne( nullptr );

	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECKUSEDEF_RET(def, use);
		MACRO_ATTRREAD_CHECK_RET("name", name, mReader->getAttributeValue);
		MACRO_ATTRREAD_CHECK_RET("reference", reference, mReader->getAttributeValue);
	MACRO_ATTRREAD_LOOPEND;

	// if "USE" defined then find already defined element.
	if(!use.empty())
	{
		MACRO_USE_CHECKANDAPPLY(def, use, ENET_MetaSet, ne);
	}
	else
	{
		ne = new CX3DImporter_NodeElement_MetaSet(NodeElement_Cur);
		if(!def.empty()) ne->ID = def;

		((CX3DImporter_NodeElement_MetaSet*)ne)->Reference = reference;
		// also metadata node can contain childs
		if(!mReader->isEmptyElement())
			ParseNode_Metadata(ne, "MetadataSet");
		else
			NodeElement_Cur->Child.push_back(ne);// made object as child to current element

		NodeElement_List.push_back(ne);// add new element to elements list.
	}// if(!use.empty()) else
}